

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_> *
kratos::filter_slice_pairs_with_target
          (vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           *__return_storage_ptr__,
          vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
          *slices,Generator *target,bool lhs)

{
  bool bVar1;
  int iVar2;
  size_type __n;
  element_type *peVar3;
  undefined4 extraout_var;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  local_90;
  __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_58;
  shared_ptr<kratos::VarSlice> *slice;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *__range1;
  bool lhs_local;
  Generator *target_local;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *slices_local;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *result;
  
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  vector(__return_storage_ptr__);
  __n = std::
        vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
        ::size(slices);
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  reserve(__return_storage_ptr__,__n);
  __end1 = std::
           vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ::begin(slices);
  slice = (shared_ptr<kratos::VarSlice> *)
          std::
          vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
          ::end(slices);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                                     *)&slice), bVar1) {
    local_58 = (__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
               ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_58);
    iVar2 = (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x10])();
    filter_assignments_with_target
              (&local_90,
               (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var,iVar2),target,lhs);
    bVar1 = std::
            unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
            ::empty(&local_90);
    std::
    unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
    ::~unordered_set(&local_90);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarSlice>const&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)__return_storage_ptr__,(shared_ptr<kratos::VarSlice> *)local_58);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<VarSlice>> filter_slice_pairs_with_target(
    const std::vector<std::shared_ptr<VarSlice>> &slices, Generator *target, bool lhs) {
    std::vector<std::shared_ptr<VarSlice>> result;
    result.reserve(slices.size());
    for (auto const &slice : slices) {
        if (!filter_assignments_with_target(slice->sources(), target, lhs).empty()) {
            result.emplace_back(slice);
        }
    }
    return result;
}